

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall slang::ast::Type::isCastCompatible(Type *this,Type *rhs)

{
  SymbolKind SVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  Type *pTVar5;
  SymbolKind kind;
  bool bVar6;
  
  pTVar3 = getCanonicalType(this);
  pTVar4 = getCanonicalType(rhs);
  bVar2 = isAssignmentCompatible(pTVar3,pTVar4);
  bVar6 = true;
  if (!bVar2) {
    pTVar5 = getCanonicalType(pTVar3);
    if ((pTVar5->super_Symbol).kind != EnumType) {
      pTVar5 = getCanonicalType(pTVar3);
      SVar1 = (pTVar5->super_Symbol).kind;
      pTVar4 = getCanonicalType(pTVar4);
      kind = (pTVar4->super_Symbol).kind;
      if (SVar1 != StringType) {
        if (kind != StringType) {
          return false;
        }
        pTVar3 = getCanonicalType(pTVar3);
        kind = (pTVar3->super_Symbol).kind;
      }
      bVar2 = IntegralType::isKind(kind);
      return bVar2;
    }
    pTVar3 = getCanonicalType(pTVar4);
    bVar2 = IntegralType::isKind((pTVar3->super_Symbol).kind);
    if (!bVar2) {
      pTVar3 = getCanonicalType(pTVar4);
      bVar6 = (pTVar3->super_Symbol).kind == FloatingType;
    }
  }
  return bVar6;
}

Assistant:

bool Type::isCastCompatible(const Type& rhs) const {
    // See [6.22.4] for Cast Compatible
    const Type* l = &getCanonicalType();
    const Type* r = &rhs.getCanonicalType();
    if (l->isAssignmentCompatible(*r))
        return true;

    if (l->isEnum())
        return r->isIntegral() || r->isFloating();

    if (l->isString())
        return r->isIntegral();

    if (r->isString())
        return l->isIntegral();

    return false;
}